

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property_value::write_as_string(property_value *this,FILE *file)

{
  value_type vVar1;
  bool bVar2;
  char *__s;
  reference pvVar3;
  byte *pbVar4;
  value_type_conflict1 local_3a;
  byte local_39;
  iterator iStack_38;
  uchar i;
  iterator __end3;
  iterator __begin3;
  byte_buffer *__range3;
  bool hasNull;
  FILE *file_local;
  property_value *this_local;
  
  putc(0x22,(FILE *)file);
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->byte_data);
  if (bVar2) {
    __s = (char *)std::__cxx11::string::c_str();
    fputs(__s,(FILE *)file);
  }
  else {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back(&this->byte_data);
    vVar1 = *pvVar3;
    if (vVar1 == '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back(&this->byte_data);
    }
    __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->byte_data);
    iStack_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->byte_data);
    while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc8), bVar2) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end3);
      local_39 = *pbVar4;
      if (local_39 == 0) {
        fputs("\", \"",(FILE *)file);
      }
      else {
        putc((uint)local_39,(FILE *)file);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end3);
    }
    if (vVar1 == '\0') {
      local_3a = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->byte_data,&local_3a);
    }
  }
  putc(0x22,(FILE *)file);
  return;
}

Assistant:

void
property_value::write_as_string(FILE *file)
{
	putc('"', file);
	if (byte_data.empty())
	{
		fputs(string_data.c_str(), file);
	}
	else
	{
		bool hasNull = (byte_data.back() == '\0');
		// Remove trailing null bytes from the string before printing as dts.
		if (hasNull)
		{
			byte_data.pop_back();
		}
		for (auto i : byte_data)
		{
			// FIXME Escape tabs, newlines, and so on.
			if (i == '\0')
			{
				fputs("\", \"", file);
				continue;
			}
			putc(i, file);
		}
		if (hasNull)
		{
			byte_data.push_back('\0');
		}
	}
	putc('"', file);
}